

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setLoggingCallback
          (CommonCore *this,LocalFederateId federateID,
          function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *logFunction)

{
  string_view message;
  bool bVar1;
  uint16_t uVar2;
  GlobalBrokerId id;
  FederateState *this_00;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  ActionMessage *in_RDX;
  long in_RDI;
  FederateState *fed;
  uint16_t index;
  ActionMessage loggerUpdate;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_fffffffffffffe88;
  ActionMessage *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  undefined2 in_stack_fffffffffffffeae;
  uint16_t uVar3;
  CommonCore *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  LocalFederateId in_stack_fffffffffffffed4;
  CommonCore *in_stack_ffffffffffffff08;
  GlobalFederateId local_e4;
  BaseType local_e0;
  GlobalFederateId local_dc;
  ActionMessage local_d8;
  undefined4 local_1c;
  LocalFederateId local_4;
  
  local_1c = 0xfffffefd;
  bVar1 = LocalFederateId::operator==(&local_4,(LocalFederateId)0xfffffefd);
  if (bVar1) {
    ActionMessage::ActionMessage
              (in_RDX,CONCAT22(in_stack_fffffffffffffeae,in_stack_fffffffffffffeac));
    local_d8.messageID = 0x250;
    local_e0 = (BaseType)
               CLI::std::atomic<helics::GlobalBrokerId>::load
                         ((atomic<helics::GlobalBrokerId> *)(in_RDI + 0x10),seq_cst);
    GlobalFederateId::GlobalFederateId(&local_dc,(GlobalBrokerId)local_e0);
    local_d8.source_id.gid = local_dc.gid;
    id = CLI::std::atomic<helics::GlobalBrokerId>::load
                   ((atomic<helics::GlobalBrokerId> *)(in_RDI + 0x10),seq_cst);
    GlobalFederateId::GlobalFederateId(&local_e4,id);
    local_d8.dest_id.gid = local_e4.gid;
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                        *)0x474a41);
    if (bVar1) {
      uVar2 = getNextAirlockIndex(in_stack_ffffffffffffff08);
      uVar3 = uVar2;
      std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::
      operator[]((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>
                  *)in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
      load<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                ((AirLock<std::any,_std::mutex,_std::condition_variable> *)in_RDX,
                 (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)CONCAT26(uVar3,CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)));
      local_d8.counter = uVar2;
    }
    else {
      setActionFlag<helics::ActionMessage,helics::MessageFlags>(&local_d8,empty_flag);
    }
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
    push<helics::ActionMessage&>
              ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
               CONCAT44(in_stack_fffffffffffffed4.fid,in_stack_fffffffffffffed0),
               (ActionMessage *)in_stack_fffffffffffffec8);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffe90);
  }
  else {
    this_00 = getFederateAt(in_stack_fffffffffffffec8,in_stack_fffffffffffffed4);
    if (this_00 == (FederateState *)0x0) {
      this_01 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_01,in_stack_fffffffffffffe98);
      message._M_len._4_2_ = in_stack_fffffffffffffeac;
      message._M_len._0_4_ = in_stack_fffffffffffffea8;
      message._M_len._6_2_ = in_stack_fffffffffffffeae;
      message._M_str = (char *)in_RDX;
      InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
      __cxa_throw(this_01,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    std::
    function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)this_00,in_stack_fffffffffffffe88);
    FederateState::setLogger
              ((FederateState *)CONCAT44(in_stack_fffffffffffffed4.fid,in_stack_fffffffffffffed0),
               (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)in_stack_fffffffffffffec8);
    std::
    function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)0x474bb2);
  }
  return;
}

Assistant:

void CommonCore::setLoggingCallback(
    LocalFederateId federateID,
    std::function<void(int, std::string_view, std::string_view)> logFunction)
{
    if (federateID == gLocalCoreId) {
        ActionMessage loggerUpdate(CMD_CORE_CONFIGURE);
        loggerUpdate.messageID = UPDATE_LOGGING_CALLBACK;
        loggerUpdate.source_id = global_id.load();
        loggerUpdate.dest_id = global_id.load();
        if (logFunction) {
            auto index = getNextAirlockIndex();
            dataAirlocks[index].load(std::move(logFunction));
            loggerUpdate.counter = index;
        } else {
            setActionFlag(loggerUpdate, empty_flag);
        }

        actionQueue.push(loggerUpdate);
    } else {
        auto* fed = getFederateAt(federateID);
        if (fed == nullptr) {
            throw(InvalidIdentifier("FederateID is not valid (setLoggingCallback)"));
        }
        fed->setLogger(std::move(logFunction));
    }
}